

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O3

uint32_t __thiscall
Handler::CalculateMigrateValue
          (Handler *this,PurchasedServer *purchasedServer,VirtualMachine *vm,LOCATION *location)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  LOCATION LVar6;
  uint uVar10;
  bool bVar7;
  int iVar8;
  uint uVar9;
  
  uVar1 = (this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
          super__Vector_impl_data._M_start[purchasedServer->serverIdx].energyCost;
  uVar2 = vm->cpuCore;
  uVar3 = vm->memorySize;
  LVar6 = *location;
  if (LVar6 == NODE_A) {
    bVar7 = CheckCapacity(purchasedServer,vm,location);
    if (!bVar7) {
      return 0;
    }
    uVar9 = *(int *)&purchasedServer->remainCpuCoreA - (uint)uVar2;
    uVar10._0_2_ = purchasedServer->remainMemorySizeA;
    uVar10._2_2_ = purchasedServer->remainMemorySizeB;
  }
  else {
    if (LVar6 != NODE_B) {
      if (LVar6 != ALL) {
        return 0;
      }
      bVar7 = CheckCapacity(purchasedServer,vm,location);
      if (!bVar7) {
        return 0;
      }
      uVar4 = purchasedServer->remainCpuCoreA;
      uVar5 = purchasedServer->remainMemorySizeA;
      iVar8 = (uint)(ushort)((uVar4 - (uVar2 & 0xfffe)) + purchasedServer->remainCpuCoreB) *
              this->migrateCpuCoreParameter;
      uVar10 = (uint)(ushort)((uVar5 - (uVar3 & 0xfffe)) + purchasedServer->remainMemorySizeB);
      goto LAB_0010ad1c;
    }
    bVar7 = CheckCapacity(purchasedServer,vm,location);
    if (!bVar7) {
      return 0;
    }
    uVar9 = (uint)purchasedServer->remainCpuCoreB - (uint)uVar2;
    uVar10 = (uint)purchasedServer->remainMemorySizeB;
  }
  iVar8 = (uVar9 & 0xffff) * this->migrateCpuCoreParameter;
  uVar10 = uVar10 - uVar3 & 0xffff;
LAB_0010ad1c:
  return (uint)uVar1 * this->migrateEnergyCostParameter +
         uVar10 * this->migrateMemorySizeParameter + iVar8;
}

Assistant:

uint32_t Handler::CalculateMigrateValue(const PurchasedServer &purchasedServer, const VirtualMachine &vm, const LOCATION &location) {
    uint16_t energyCost = servers[purchasedServer.serverIdx].energyCost;
    uint16_t cpuCore = vm.cpuCore;
    uint16_t memorySize = vm.memorySize;

    if (location == ALL && CheckCapacity(purchasedServer, vm, location)) {
        uint16_t halfCpuCore = cpuCore >> 1u;
        uint16_t halfMemorySize = memorySize >> 1u;
        uint16_t remainCpuCoreA = purchasedServer.remainCpuCoreA - halfCpuCore;
        uint16_t remainMemorySizeA = purchasedServer.remainMemorySizeA - halfMemorySize;
        uint16_t remainCpuCoreB = purchasedServer.remainCpuCoreB - halfCpuCore;
        uint16_t remainMemorySizeB = purchasedServer.remainMemorySizeB - halfMemorySize;
        return CalculateMigrateValue(remainCpuCoreA + remainCpuCoreB, remainMemorySizeA + remainMemorySizeB, energyCost);
    }

    if (location == NODE_A && CheckCapacity(purchasedServer, vm, location)) {
        uint16_t remainCpuCoreA = purchasedServer.remainCpuCoreA - cpuCore;
        uint16_t remainMemorySizeA = purchasedServer.remainMemorySizeA - memorySize;
        return CalculateMigrateValue(remainCpuCoreA, remainMemorySizeA, energyCost);
    }

    if (location == NODE_B && CheckCapacity(purchasedServer, vm, location)) {
        uint16_t remainCpuCoreB = purchasedServer.remainCpuCoreB - cpuCore;
        uint16_t remainMemorySizeB = purchasedServer.remainMemorySizeB - memorySize;
        return CalculateMigrateValue(remainCpuCoreB, remainMemorySizeB, energyCost);
    }

    return 0u;
}